

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O3

void gba_rtc_write(gpio_port_t value,uint8_t mask)

{
  rtc_t *prVar1;
  uint64_t *puVar2;
  uint8_t uVar3;
  gbabus_t *pgVar4;
  byte bVar5;
  void *__s;
  int iVar6;
  rtc_state_t rVar7;
  undefined7 in_register_00000031;
  char *__s_00;
  uint8_t *puVar8;
  size_t __size;
  bool bVar9;
  
  pgVar4 = bus;
  rVar7 = (rtc_state_t)CONCAT71(in_register_00000031,mask);
  prVar1 = &bus->rtc;
  if (1 < gba_log_verbosity) {
    rVar7 = prVar1->state;
    printf("\x1b[0;36m[INFO]  state: %d SCK: %d SIO: %d CS: %d\n\x1b[0;m",(ulong)rVar7,
           (ulong)(value.raw & 1),(ulong)(value.raw >> 1 & 1),(ulong)(value.raw >> 2 & 1));
  }
  switch(prVar1->state) {
  case RTC_READY:
    break;
  case RTC_COMMAND_MODE_1:
    if (((value.raw & 4) != 0) && ((value.raw & 1) != 0)) {
      prVar1->state = RTC_COMMAND_MODE_2;
      goto LAB_00120865;
    }
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state\n\x1b[0;m"
             ,(ulong)((value.raw & 4) >> 2),(ulong)(value.raw & 1));
    }
LAB_0012071f:
    prVar1->state = RTC_COMMAND_MODE_1;
    goto LAB_00120865;
  case RTC_COMMAND_MODE_2:
    if ((value.raw & 5) == 4) {
      puVar8 = &(pgVar4->rtc).command_buffer;
      *puVar8 = *puVar8 | (value.raw >> 1 & 1) << ((byte)(pgVar4->rtc).current_command_bit & 0x1f);
      goto LAB_00120865;
    }
    if (((value.raw & 4) != 0) && ((value.raw & 1) != 0)) {
      iVar6 = (pgVar4->rtc).current_command_bit;
      bVar5 = (value.raw >> 1 & 1) << ((byte)iVar6 & 0x1f) | (pgVar4->rtc).command_buffer;
      (pgVar4->rtc).command_buffer = bVar5;
      iVar6 = iVar6 + 1;
      (pgVar4->rtc).current_command_bit = iVar6;
      if (iVar6 != 8) goto LAB_00120865;
      if ((bVar5 & 0xf0) == 0x60) {
        bVar5 = bVar5 << 4 | bVar5 >> 4;
        bVar5 = bVar5 >> 2 & 0x33 | (bVar5 & 0x33) << 2;
        (pgVar4->rtc).command_buffer = bVar5 >> 1 & 0x55 | (bVar5 & 0x55) * '\x02';
        if (2 < gba_log_verbosity) {
          __s_00 = "[DEBUG] [GPIO] [RTC] Need to reverse the command.";
LAB_001208a2:
          puts(__s_00);
        }
      }
      else if (((bVar5 & 0xf) == 6) && (2 < gba_log_verbosity)) {
        __s_00 = "[DEBUG] [GPIO] [RTC] Already got the command in a good order.";
        goto LAB_001208a2;
      }
      run_command((pgVar4->rtc).command_buffer >> 4);
      goto LAB_00120865;
    }
    gba_rtc_write_cold_4();
  default:
    gba_rtc_write_cold_6();
    goto LAB_001208d1;
  case RTC_DATA_READ:
    if ((value.raw & 4) != 0) {
      bVar9 = (value.raw & 1) == 0;
      if (!bVar9) {
        if (((bus->port).raw & 1) == 0) {
          (bus->port).raw = (bus->port).raw & 0xfc | (char)(pgVar4->rtc).buffer * '\x02' & 2U;
          puVar2 = &(pgVar4->rtc).buffer;
          *puVar2 = *puVar2 >> 1;
        }
        goto LAB_00120865;
      }
      if (bVar9) goto LAB_00120865;
      gba_rtc_write_cold_3();
      goto LAB_00120820;
    }
    goto LAB_0012085e;
  case RTC_DATA_WRITE:
    goto switchD_001205f2_caseD_4;
  }
  (pgVar4->rtc).command_buffer = '\0';
  (pgVar4->rtc).current_command_bit = 0;
  if (((value.raw >> 2 & 1) == 0) && ((value.raw & 1) != 0)) goto LAB_0012071f;
  rVar7 = (rtc_state_t)value.raw;
  gba_rtc_write_cold_5();
switchD_001205f2_caseD_4:
  if ((value.raw & 4) == 0) {
    if ((value.raw & 1) != 0) {
      uVar3 = (pgVar4->rtc).reg;
      if (uVar3 == '\x04') {
LAB_00120820:
        bVar5 = (byte)(pgVar4->rtc).buffer;
        bVar5 = bVar5 << 4 | bVar5 >> 4;
        bVar5 = bVar5 >> 2 & 0x33 | (bVar5 & 0x33) << 2;
        bVar5 = bVar5 >> 1 & 0x55 | (bVar5 & 0x55) * '\x02';
        (pgVar4->rtc).control_reg.raw = bVar5;
        printf("Control reg is now: 0x%02X\n",(ulong)bVar5);
      }
      else {
        if (uVar3 != '\0') goto LAB_001208e6;
        puts("RESET");
        (pgVar4->rtc).buffer = 0;
        (pgVar4->rtc).control_reg.raw = '\0';
      }
LAB_0012085e:
      prVar1->state = RTC_READY;
      goto LAB_00120865;
    }
LAB_001208d1:
    rVar7 = value.raw & RTC_COMMAND_MODE_1;
  }
  else {
    bVar9 = (value.raw & 1) != 0;
    if (bVar9) {
      (pgVar4->rtc).buffer = (pgVar4->rtc).buffer * 2 & (pgVar4->rtc).write_mask;
LAB_00120865:
      (bus->port).raw = ~mask & (bus->port).raw | value.raw;
      return;
    }
    if (!bVar9) {
      (pgVar4->rtc).buffer = (ulong)(value.raw >> 1) & 1 | (pgVar4->rtc).buffer & 0xfffffffffffffffe
      ;
      printf("RTC write buffer: 0x%lX\n");
      goto LAB_00120865;
    }
    rVar7 = RTC_COMMAND_MODE_1;
  }
  gba_rtc_write_cold_1();
LAB_001208e6:
  puVar8 = &(pgVar4->rtc).reg;
  gba_rtc_write_cold_2();
  __size = 0x2000;
  if (rVar7 == RTC_READY) {
    __size = 0x200;
  }
  __s = malloc(__size);
  *(void **)(puVar8 + 0x48018) = __s;
  memset(__s,0xff,__size);
  *(size_t *)(puVar8 + 0x48010) = __size;
  puVar8[0x48058] = 1;
  read_persisted_backup();
  return;
}

Assistant:

void gba_rtc_write(gpio_port_t value, byte mask) {
    rtc_t* rtc = &bus->rtc;
    loginfo("state: %d SCK: %d SIO: %d CS: %d", rtc->state, value.rtc_sck, value.rtc_sio, value.rtc_cs);

    switch (rtc->state) {
        case RTC_READY:
            rtc->command_buffer = 0;
            rtc->current_command_bit = 0;
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_1;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in READY state", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_COMMAND_MODE_1:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_2;
            } else {
                logwarn("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state", value.rtc_cs, value.rtc_sck)
                rtc->state = RTC_COMMAND_MODE_1;
            }
            break;
        case RTC_COMMAND_MODE_2:
            if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
                if (++rtc->current_command_bit == 8) {
                    if ((rtc->command_buffer >> 4) == 6) {
                        rtc->command_buffer = reverse(rtc->command_buffer);
                        logdebug("[GPIO] [RTC] Need to reverse the command.");
                    } else if ((rtc->command_buffer & 0xF) == 6) {
                        logdebug("[GPIO] [RTC] Already got the command in a good order.");
                    }
                    // Command passed validity check and is now in the correct order. Command is in the upper 4 bits,
                    // Lower 4 are always a 6.
                    run_command((rtc->command_buffer >> 4) & 0xF);
                }
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_2 state (command 0x%02X)", value.rtc_cs, value.rtc_sck, rtc->command_buffer)
            }
            break;
        case RTC_DATA_READ:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                // If the value here used to be 0, send the next data bit
                if (bus->port.rtc_sck == 0) {
                    bus->port.rtc_sio = rtc->buffer & 1;
                    rtc->buffer >>= 1;
                }
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                // Ignore
            } else if (value.rtc_cs == 0) {
                rtc->state = RTC_READY;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_READ", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_DATA_WRITE:
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                switch (rtc->reg) {
                    case RESET_REG:
                        printf("RESET\n");
                        rtc->buffer = 0;
                        rtc->control_reg.raw = 0;
                        break;
                    case CONTROL_REG:
                        rtc->control_reg.raw = reverse(rtc->buffer & 0xFF);
                        printf("Control reg is now: 0x%02X\n", rtc->control_reg.raw);
                        break;
                    default:
                        logfatal("Wrote to unknown register: %d", rtc->reg)
                }
                rtc->state = RTC_READY;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->buffer <<= 1;
                rtc->buffer &= rtc->write_mask;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                rtc->buffer &= 0xFFFFFFFFFFFFFFFE;
                rtc->buffer |= (value.rtc_sio & 1);
                printf("RTC write buffer: 0x%lX\n", rtc->buffer);
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_WRITE", value.rtc_cs, value.rtc_sck)
            }
            break;
        default:
            logfatal("Write to GPIO while in unknown state: %d", rtc->state)
    }

    bus->port.raw &= ~mask;
    bus->port.raw |= value.raw;
}